

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

int __thiscall
unodb::detail::
basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::init(basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
       *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  value_type vVar2;
  int extraout_EAX;
  reference this_00;
  reference pvVar3;
  reference this_01;
  pointer pbVar4;
  reference peVar5;
  unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  *in_RCX;
  olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *in_RDX;
  basic_node_ptr<unodb::detail::olc_node_header> local_88;
  key_view local_80;
  element_type local_69;
  basic_node_ptr<unodb::detail::olc_node_header> bStack_68;
  uint8_t key_byte;
  basic_node_ptr<unodb::detail::olc_node_header> local_60;
  basic_node_ptr<unodb::detail::olc_node_header> local_58;
  byte local_49;
  uint local_48;
  int iStack_44;
  uchar children_i;
  uint i;
  uint children_copied;
  db_inode_reclaimable_ptr<unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte>_>_>
  reclaim_source_node;
  db_leaf_unique_ptr *child_local;
  inode48_type *source_node_local;
  db_type *db_instance_local;
  basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *this_local;
  tree_depth_type depth_local;
  
  basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
  ::
  make_db_inode_reclaimable_ptr<unodb::detail::olc_inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
            ((basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
              *)&i,in_RDX,(db_type *)ctx);
  iStack_44 = 0;
  local_48 = 0;
  do {
    this_00 = std::array<unodb::in_critical_section<unsigned_char>,_256UL>::operator[]
                        (&(in_RDX->
                          super_olc_inode_48_parent<unsigned_long,_std::span<const_std::byte>_>).
                          child_indexes,(ulong)local_48);
    local_49 = in_critical_section<unsigned_char>::load(this_00);
    if (local_49 == 0xff) {
      basic_node_ptr<unodb::detail::olc_node_header>::basic_node_ptr(&local_58,(nullptr_t)0x0);
      pvVar3 = std::
               array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_256UL>
               ::operator[](&this->children,(ulong)local_48);
      in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::operator=
                (pvVar3,local_58);
    }
    else {
      this_01 = std::
                array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_48UL>
                ::operator[](&(in_RDX->
                              super_olc_inode_48_parent<unsigned_long,_std::span<const_std::byte>_>)
                              .children.pointer_array,(ulong)local_49);
      local_60 = in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                 ::load(this_01);
      pvVar3 = std::
               array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_256UL>
               ::operator[](&this->children,(ulong)local_48);
      in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::operator=
                (pvVar3,local_60);
      iStack_44 = iStack_44 + 1;
      if (iStack_44 == 0x30) {
        iStack_44 = 0x30;
        while (local_48 = local_48 + 1, local_48 < 0x100) {
          basic_node_ptr<unodb::detail::olc_node_header>::basic_node_ptr
                    (&stack0xffffffffffffff98,(nullptr_t)0x0);
          pvVar3 = std::
                   array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_256UL>
                   ::operator[](&this->children,(ulong)local_48);
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::
          operator=(pvVar3,bStack_68);
        }
        pbVar4 = std::
                 unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 ::operator->(in_RCX);
        local_80 = basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::get_key_view(pbVar4);
        vVar2 = tree_depth::operator_cast_to_unsigned_int((tree_depth *)((long)&this_local + 4));
        peVar5 = std::span<const_std::byte,_18446744073709551615UL>::operator[]
                           (&local_80,(ulong)vVar2);
        local_69 = *peVar5;
        pvVar3 = std::
                 array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_256UL>
                 ::operator[](&this->children,(ulong)local_69);
        bVar1 = in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                ::operator==(pvVar3,(nullptr_t)0x0);
        if (bVar1) {
          pbVar4 = std::
                   unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   ::release(in_RCX);
          basic_node_ptr<unodb::detail::olc_node_header>::basic_node_ptr
                    (&local_88,&pbVar4->super_olc_node_header,LEAF);
          pvVar3 = std::
                   array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_256UL>
                   ::operator[](&this->children,(ulong)local_69);
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::
          operator=(pvVar3,local_88);
          std::
          unique_ptr<unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         *)&i);
          return extraout_EAX;
        }
        __assert_fail("children[key_byte] == nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                      ,0xa74,
                      "void unodb::detail::basic_inode_256<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::init(db_type &, inode48_type &__restrict, db_leaf_unique_ptr, tree_depth_type) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                     );
      }
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

constexpr void init(db_type &db_instance,
                      inode48_type &__restrict source_node,
                      db_leaf_unique_ptr child,
                      tree_depth_type depth) noexcept {
    const auto reclaim_source_node{
        ArtPolicy::template make_db_inode_reclaimable_ptr<inode48_type>(
            &source_node, db_instance)};
    unsigned children_copied = 0;
    unsigned i = 0;
    while (true) {
      const auto children_i = source_node.child_indexes[i].load();
      if (children_i == inode48_type::empty_child) {
        children[i] = node_ptr{nullptr};
      } else {
        children[i] = source_node.children.pointer_array[children_i].load();
        ++children_copied;
        if (children_copied == inode48_type::capacity) break;
      }
      ++i;
    }

    ++i;
    for (; i < basic_inode_256::capacity; ++i) children[i] = node_ptr{nullptr};

    const auto key_byte = static_cast<uint8_t>(child->get_key_view()[depth]);
    UNODB_DETAIL_ASSERT(children[key_byte] == nullptr);
    children[key_byte] = node_ptr{child.release(), node_type::LEAF};
  }